

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::InstanceIntersectorK<4>_>,_false>
     ::occludedCoherent(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  AccelData *pAVar1;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  long lVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  uint uVar28;
  undefined4 uVar29;
  ulong uVar30;
  StackItemMaskT<embree::NodeRefPtr<8>_> *pSVar31;
  size_t sVar32;
  size_t sVar33;
  ulong uVar34;
  size_t sVar35;
  Primitive *prim;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  StackItemMaskT<embree::NodeRefPtr<8>_> *pSVar40;
  bool bVar41;
  bool bVar42;
  vint4 ai;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar45;
  undefined1 in_ZMM0 [64];
  undefined1 auVar46 [64];
  vint4 ai_1;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vint4 ai_3;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  vint4 bi;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  vint4 bi_1;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  vint4 bi_3;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  vint4 ai_2;
  vint4 bi_2;
  undefined1 in_ZMM7 [64];
  undefined1 auVar61 [64];
  float fVar62;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  float fVar68;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar69 [16];
  undefined1 auVar70 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  Precalculations pre;
  ulong local_26d0;
  vbool<4> valid0;
  undefined1 local_2678 [16];
  vint4 bi_8;
  undefined8 local_2658;
  undefined1 local_25f8 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 local_25e8;
  undefined1 local_25d8 [16];
  undefined4 local_25c8;
  undefined4 uStack_25c4;
  undefined4 uStack_25c0;
  undefined4 uStack_25bc;
  undefined1 local_25b8 [16];
  undefined1 local_25a8 [16];
  float local_2598;
  float fStack_2594;
  float fStack_2590;
  float fStack_258c;
  float local_2588;
  float fStack_2584;
  float fStack_2580;
  float fStack_257c;
  undefined4 local_2578;
  undefined4 uStack_2574;
  undefined4 uStack_2570;
  undefined4 uStack_256c;
  undefined4 uStack_2568;
  undefined4 uStack_2564;
  undefined4 uStack_2560;
  undefined4 uStack_255c;
  float local_2558;
  float fStack_2554;
  float fStack_2550;
  float fStack_254c;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 local_2548;
  uint local_2538;
  uint uStack_2534;
  uint uStack_2530;
  uint uStack_252c;
  uint uStack_2528;
  uint uStack_2524;
  uint uStack_2520;
  uint uStack_251c;
  undefined4 local_2518;
  undefined4 uStack_2514;
  undefined4 uStack_2510;
  undefined4 uStack_250c;
  undefined4 uStack_2508;
  undefined4 uStack_2504;
  undefined4 uStack_2500;
  undefined4 uStack_24fc;
  uint local_24f8;
  uint uStack_24f4;
  uint uStack_24f0;
  uint uStack_24ec;
  uint uStack_24e8;
  uint uStack_24e4;
  uint uStack_24e0;
  uint uStack_24dc;
  undefined8 local_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 uStack_24c0;
  uint local_24b8;
  uint uStack_24b4;
  uint uStack_24b0;
  uint uStack_24ac;
  uint uStack_24a8;
  uint uStack_24a4;
  uint uStack_24a0;
  uint uStack_249c;
  undefined8 local_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 uStack_2480;
  uint local_2478;
  uint uStack_2474;
  uint uStack_2470;
  uint uStack_246c;
  uint uStack_2468;
  uint uStack_2464;
  uint uStack_2460;
  uint uStack_245c;
  float local_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  float fStack_2440;
  float fStack_243c;
  uint local_2438;
  uint uStack_2434;
  uint uStack_2430;
  uint uStack_242c;
  uint uStack_2428;
  uint uStack_2424;
  uint uStack_2420;
  uint uStack_241c;
  undefined8 local_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 uStack_2400;
  undefined1 local_23f8 [32];
  undefined8 local_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 uStack_23c0;
  uint local_23b8;
  uint uStack_23b4;
  uint uStack_23b0;
  uint uStack_23ac;
  uint uStack_23a8;
  uint uStack_23a4;
  uint uStack_23a0;
  uint uStack_239c;
  float local_2398;
  float fStack_2394;
  float fStack_2390;
  float fStack_238c;
  float fStack_2388;
  float fStack_2384;
  float fStack_2380;
  float fStack_237c;
  StackItemMaskT<embree::NodeRefPtr<8>_> stack [564];
  
  auVar6 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar6 = vpcmpeqd_avx((undefined1  [16])valid_i->field_0,auVar6);
  uVar28 = vmovmskps_avx(auVar6);
  if (uVar28 == 0) {
    return;
  }
  local_25e8 = valid_i->field_0;
  pAVar1 = This->ptr;
  uVar37 = (ulong)(uVar28 & 0xff);
  auVar50 = *(undefined1 (*) [16])(ray + 0x20);
  auVar53._8_4_ = 0x7fffffff;
  auVar53._0_8_ = 0x7fffffff7fffffff;
  auVar53._12_4_ = 0x7fffffff;
  auVar43 = *(undefined1 (*) [16])(ray + 0x40);
  auVar47 = vandps_avx(auVar43,auVar53);
  auVar59._8_4_ = 0x219392ef;
  auVar59._0_8_ = 0x219392ef219392ef;
  auVar59._12_4_ = 0x219392ef;
  auVar47 = vcmpps_avx(auVar47,auVar59,1);
  auVar3 = vblendvps_avx(auVar43,auVar59,auVar47);
  auVar47 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar53);
  auVar47 = vcmpps_avx(auVar47,auVar59,1);
  auVar49 = vpcmpeqd_avx(in_ZMM7._0_16_,in_ZMM7._0_16_);
  auVar4 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar59,auVar47);
  auVar47 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar53);
  auVar47 = vcmpps_avx(auVar47,auVar59,1);
  auVar47 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar59,auVar47);
  auVar53 = vrcpps_avx(auVar3);
  auVar57._8_4_ = 0x3f800000;
  auVar57._0_8_ = &DAT_3f8000003f800000;
  auVar57._12_4_ = 0x3f800000;
  auVar3 = vfnmadd213ps_fma(auVar3,auVar53,auVar57);
  auVar53 = vfmadd132ps_fma(auVar3,auVar53,auVar53);
  auVar3 = vrcpps_avx(auVar4);
  auVar4 = vfnmadd213ps_fma(auVar4,auVar3,auVar57);
  auVar4 = vfmadd132ps_fma(auVar4,auVar3,auVar3);
  auVar3 = vrcpps_avx(auVar47);
  auVar47 = vfnmadd213ps_fma(auVar47,auVar3,auVar57);
  auVar3 = vfmadd132ps_fma(auVar47,auVar3,auVar3);
  auVar51 = ZEXT816(0);
  local_25a8 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar51);
  local_25b8 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar51);
  auVar61 = ZEXT1664(auVar6 ^ auVar49);
  auVar43 = vcmpps_avx(auVar43,auVar51,1);
  auVar47._8_4_ = 1;
  auVar47._0_8_ = 0x100000001;
  auVar47._12_4_ = 1;
  auVar43 = vandps_avx(auVar43,auVar47);
  auVar54._8_4_ = 2;
  auVar54._0_8_ = 0x200000002;
  auVar54._12_4_ = 2;
  auVar47 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar51,1);
  auVar47 = vandps_avx(auVar47,auVar54);
  auVar47 = vorps_avx(auVar47,auVar43);
  auVar43 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar51,1);
  auVar51._8_4_ = 4;
  auVar51._0_8_ = 0x400000004;
  auVar51._12_4_ = 4;
  auVar43 = vandps_avx(auVar43,auVar51);
  auVar6 = vpor_avx(auVar6 ^ auVar49,auVar43);
  local_25f8 = vpor_avx(auVar6,auVar47);
  local_2588 = *(float *)ray;
  fStack_2584 = *(float *)(ray + 4);
  fStack_2580 = *(float *)(ray + 8);
  fStack_257c = *(float *)(ray + 0xc);
  fVar62 = auVar53._0_4_ * -*(float *)ray;
  fVar65 = auVar53._4_4_ * -*(float *)(ray + 4);
  fVar66 = auVar53._8_4_ * -*(float *)(ray + 8);
  fVar67 = auVar53._12_4_ * -*(float *)(ray + 0xc);
  local_2598 = *(float *)(ray + 0x10);
  fStack_2594 = *(float *)(ray + 0x14);
  fStack_2590 = *(float *)(ray + 0x18);
  fStack_258c = *(float *)(ray + 0x1c);
  fVar68 = auVar4._0_4_ * -*(float *)(ray + 0x10);
  fVar71 = auVar4._4_4_ * -*(float *)(ray + 0x14);
  fVar72 = auVar4._8_4_ * -*(float *)(ray + 0x18);
  fVar73 = auVar4._12_4_ * -*(float *)(ray + 0x1c);
  auVar75 = ZEXT1664(auVar50);
  local_2558 = auVar3._0_4_ * -auVar50._0_4_;
  fStack_2554 = auVar3._4_4_ * -auVar50._4_4_;
  fStack_2550 = auVar3._8_4_ * -auVar50._8_4_;
  fStack_254c = auVar3._12_4_ * -auVar50._12_4_;
  local_2538 = 0x80000000;
  uStack_2534 = 0x80000000;
  uStack_2530 = 0x80000000;
  uStack_252c = 0x80000000;
  uStack_2528 = 0x80000000;
  uStack_2524 = 0x80000000;
  uStack_2520 = 0x80000000;
  uStack_251c = 0x80000000;
  local_25c8 = 0x7f800000;
  uStack_25c4 = 0x7f800000;
  uStack_25c0 = 0x7f800000;
  uStack_25bc = 0x7f800000;
LAB_00677d5d:
  pSVar31 = stack + 1;
  lVar13 = 0;
  for (uVar34 = uVar37; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
    lVar13 = lVar13 + 1;
  }
  uVar29 = *(undefined4 *)(local_25f8 + lVar13 * 4);
  auVar43._4_4_ = uVar29;
  auVar43._0_4_ = uVar29;
  auVar43._8_4_ = uVar29;
  auVar43._12_4_ = uVar29;
  local_2678 = vpcmpeqd_avx(auVar43,local_25f8);
  uVar29 = vmovmskps_avx(local_2678);
  stack[0].mask = CONCAT44((int)((ulong)lVar13 >> 0x20),uVar29);
  auVar69._8_4_ = 0x7f800000;
  auVar69._0_8_ = 0x7f8000007f800000;
  auVar69._12_4_ = 0x7f800000;
  auVar6 = vblendvps_avx(auVar69,auVar53,local_2678);
  uVar37 = ~stack[0].mask & uVar37;
  auVar43 = vshufps_avx(auVar6,auVar6,0xb1);
  auVar6 = vminps_avx(auVar43,auVar6);
  auVar43 = vshufpd_avx(auVar6,auVar6,1);
  auVar43 = vminps_avx(auVar43,auVar6);
  auVar6 = vblendvps_avx(auVar69,auVar4,local_2678);
  auVar47 = vshufps_avx(auVar6,auVar6,0xb1);
  auVar6 = vminps_avx(auVar47,auVar6);
  auVar47 = vshufpd_avx(auVar6,auVar6,1);
  auVar6 = vminps_avx(auVar47,auVar6);
  auVar43 = vinsertps_avx(auVar43,auVar6,0x1c);
  auVar6 = vblendvps_avx(auVar69,auVar3,local_2678);
  auVar47 = vshufps_avx(auVar6,auVar6,0xb1);
  auVar6 = vminps_avx(auVar47,auVar6);
  auVar47 = vshufpd_avx(auVar6,auVar6,1);
  auVar47 = vminps_avx(auVar47,auVar6);
  auVar63._8_4_ = 0xff800000;
  auVar63._0_8_ = 0xff800000ff800000;
  auVar63._12_4_ = 0xff800000;
  auVar6 = vblendvps_avx(auVar63,auVar53,local_2678);
  auVar54 = vinsertps_avx(auVar43,auVar47,0x20);
  auVar43 = vshufps_avx(auVar6,auVar6,0xb1);
  auVar6 = vmaxps_avx(auVar43,auVar6);
  auVar43 = vshufpd_avx(auVar6,auVar6,1);
  auVar43 = vmaxps_avx(auVar43,auVar6);
  auVar6 = vblendvps_avx(auVar63,auVar4,local_2678);
  auVar47 = vshufps_avx(auVar6,auVar6,0xb1);
  auVar6 = vmaxps_avx(auVar47,auVar6);
  auVar47 = vshufpd_avx(auVar6,auVar6,1);
  auVar6 = vmaxps_avx(auVar47,auVar6);
  auVar43 = vinsertps_avx(auVar43,auVar6,0x1c);
  auVar6 = vblendvps_avx(auVar63,auVar3,local_2678);
  auVar47 = vshufps_avx(auVar6,auVar6,0xb1);
  auVar6 = vmaxps_avx(auVar47,auVar6);
  auVar47 = vshufpd_avx(auVar6,auVar6,1);
  auVar6 = vmaxps_avx(auVar47,auVar6);
  auVar57 = vinsertps_avx(auVar43,auVar6,0x20);
  auVar51 = vcmpps_avx(auVar54,_DAT_01feba10,5);
  auVar6 = vblendvps_avx(auVar57,auVar54,auVar51);
  auVar5 = vmovshdup_avx(auVar6);
  uVar39 = (ulong)(auVar5._0_4_ < 0.0) << 5 | 0x40;
  auVar43 = vshufpd_avx(auVar6,auVar6,1);
  uVar34 = (ulong)(auVar43._0_4_ < 0.0) << 5 | 0x80;
  local_2398 = auVar6._0_4_;
  auVar8._4_4_ = fStack_2584;
  auVar8._0_4_ = local_2588;
  auVar8._8_4_ = fStack_2580;
  auVar8._12_4_ = fStack_257c;
  auVar43 = vblendvps_avx(auVar69,auVar8,local_2678);
  auVar47 = vshufps_avx(auVar43,auVar43,0xb1);
  auVar43 = vminps_avx(auVar47,auVar43);
  auVar47 = vshufpd_avx(auVar43,auVar43,1);
  auVar47 = vminps_avx(auVar47,auVar43);
  auVar7._4_4_ = fStack_2594;
  auVar7._0_4_ = local_2598;
  auVar7._8_4_ = fStack_2590;
  auVar7._12_4_ = fStack_258c;
  auVar43 = vblendvps_avx(auVar69,auVar7,local_2678);
  auVar49 = vshufps_avx(auVar43,auVar43,0xb1);
  auVar43 = vminps_avx(auVar49,auVar43);
  auVar49 = vshufpd_avx(auVar43,auVar43,1);
  auVar49 = vminps_avx(auVar49,auVar43);
  auVar44 = auVar75._0_16_;
  auVar43 = vblendvps_avx(auVar69,auVar44,local_2678);
  auVar47 = vinsertps_avx(auVar47,auVar49,0x1c);
  auVar49 = vshufps_avx(auVar43,auVar43,0xb1);
  auVar43 = vminps_avx(auVar49,auVar43);
  auVar49 = vshufpd_avx(auVar43,auVar43,1);
  auVar43 = vminps_avx(auVar49,auVar43);
  auVar47 = vinsertps_avx(auVar47,auVar43,0x20);
  auVar43 = vblendvps_avx(auVar63,auVar8,local_2678);
  auVar49 = vshufps_avx(auVar43,auVar43,0xb1);
  auVar43 = vmaxps_avx(auVar49,auVar43);
  auVar49 = vshufpd_avx(auVar43,auVar43,1);
  auVar49 = vmaxps_avx(auVar49,auVar43);
  auVar43 = vblendvps_avx(auVar63,auVar7,local_2678);
  auVar59 = vshufps_avx(auVar43,auVar43,0xb1);
  auVar43 = vmaxps_avx(auVar59,auVar43);
  auVar59 = vshufpd_avx(auVar43,auVar43,1);
  auVar59 = vmaxps_avx(auVar59,auVar43);
  auVar43 = vblendvps_avx(auVar63,auVar44,local_2678);
  auVar49 = vinsertps_avx(auVar49,auVar59,0x1c);
  auVar59 = vshufps_avx(auVar43,auVar43,0xb1);
  auVar43 = vmaxps_avx(auVar59,auVar43);
  auVar59 = vshufpd_avx(auVar43,auVar43,1);
  auVar43 = vmaxps_avx(auVar59,auVar43);
  auVar49 = vinsertps_avx(auVar49,auVar43,0x20);
  auVar43 = vblendvps_avx(auVar49,auVar47,auVar51);
  auVar47 = vblendvps_avx(auVar47,auVar49,auVar51);
  bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                 vblendvps_avx(auVar63,local_25b8,local_2678);
  auVar49 = vshufps_avx((undefined1  [16])bi_8.field_0,(undefined1  [16])bi_8.field_0,0xb1);
  auVar59 = vmaxps_avx(auVar49,(undefined1  [16])bi_8.field_0);
  auVar49 = vblendvps_avx(auVar69,local_25a8,local_2678);
  auVar7 = vshufpd_avx(auVar59,auVar59,1);
  auVar8 = vshufps_avx(auVar49,auVar49,0xb1);
  auVar49 = vminps_avx(auVar8,auVar49);
  auVar8 = vshufpd_avx(auVar49,auVar49,1);
  auVar49 = vminps_avx(auVar8,auVar49);
  local_2578 = auVar49._0_4_;
  auVar61 = ZEXT1664(auVar61._0_16_);
  auVar70 = ZEXT1664(CONCAT412(fVar73,CONCAT48(fVar72,CONCAT44(fVar71,fVar68))));
  auVar59 = vmaxps_avx(auVar7,auVar59);
  auVar49 = vblendvps_avx(auVar54,auVar57,auVar51);
  auVar74._0_4_ = auVar47._0_4_ * local_2398;
  auVar74._4_4_ = auVar47._4_4_ * auVar6._4_4_;
  auVar74._8_4_ = auVar47._8_4_ * auVar6._8_4_;
  auVar74._12_4_ = auVar47._12_4_ * auVar6._12_4_;
  local_2458 = auVar49._0_4_;
  auVar55._0_4_ = auVar43._0_4_ * local_2458;
  auVar55._4_4_ = auVar43._4_4_ * auVar49._4_4_;
  auVar55._8_4_ = auVar43._8_4_ * auVar49._8_4_;
  auVar55._12_4_ = auVar43._12_4_ * auVar49._12_4_;
  uVar38 = (ulong)(local_2398 < 0.0) * 0x20;
  stack[0].ptr.ptr = *(size_t *)&pAVar1[1].bounds.bounds0.lower.field_0;
  fStack_2394 = local_2398;
  fStack_2390 = local_2398;
  fStack_238c = local_2398;
  fStack_2388 = local_2398;
  fStack_2384 = local_2398;
  fStack_2380 = local_2398;
  fStack_237c = local_2398;
  local_23b8 = local_2538 ^ (uint)auVar74._0_4_;
  uStack_23b4 = uStack_2534 ^ (uint)auVar74._0_4_;
  uStack_23b0 = uStack_2530 ^ (uint)auVar74._0_4_;
  uStack_23ac = uStack_252c ^ (uint)auVar74._0_4_;
  uStack_23a8 = uStack_2528 ^ (uint)auVar74._0_4_;
  uStack_23a4 = uStack_2524 ^ (uint)auVar74._0_4_;
  uStack_23a0 = uStack_2520 ^ (uint)auVar74._0_4_;
  uStack_239c = uStack_251c ^ (uint)auVar74._0_4_;
  local_2658 = auVar5._0_8_;
  local_23d8 = local_2658;
  uStack_23d0 = local_2658;
  uStack_23c8 = local_2658;
  uStack_23c0 = local_2658;
  auVar43 = vmovshdup_avx(auVar74);
  uVar28 = auVar43._0_4_;
  local_23f8._0_4_ = local_2538 ^ uVar28;
  uVar9 = auVar43._4_4_;
  local_23f8._4_4_ = uStack_2534 ^ uVar9;
  local_23f8._8_4_ = uStack_2530 ^ uVar28;
  local_23f8._12_4_ = uStack_252c ^ uVar9;
  local_23f8._16_4_ = uStack_2528 ^ uVar28;
  local_23f8._20_4_ = uStack_2524 ^ uVar9;
  local_23f8._24_4_ = uStack_2520 ^ uVar28;
  local_23f8._28_4_ = uStack_251c ^ uVar9;
  auVar6 = vshufps_avx(auVar6,auVar6,0xaa);
  local_2418 = auVar6._0_8_;
  uStack_2410 = local_2418;
  uStack_2408 = local_2418;
  uStack_2400 = local_2418;
  auVar6 = vshufps_avx(auVar74,auVar74,0xaa);
  uVar28 = auVar6._0_4_;
  uVar9 = auVar6._4_4_;
  local_2438 = local_2538 ^ uVar28;
  uStack_2434 = uStack_2534 ^ uVar9;
  uStack_2430 = uStack_2530 ^ uVar28;
  uStack_242c = uStack_252c ^ uVar9;
  uStack_2428 = uStack_2528 ^ uVar28;
  uStack_2424 = uStack_2524 ^ uVar9;
  uStack_2420 = uStack_2520 ^ uVar28;
  uStack_241c = uStack_251c ^ uVar9;
  fStack_2454 = local_2458;
  fStack_2450 = local_2458;
  fStack_244c = local_2458;
  fStack_2448 = local_2458;
  fStack_2444 = local_2458;
  fStack_2440 = local_2458;
  fStack_243c = local_2458;
  local_2478 = local_2538 ^ (uint)auVar55._0_4_;
  uStack_2474 = uStack_2534 ^ (uint)auVar55._0_4_;
  uStack_2470 = uStack_2530 ^ (uint)auVar55._0_4_;
  uStack_246c = uStack_252c ^ (uint)auVar55._0_4_;
  uStack_2468 = uStack_2528 ^ (uint)auVar55._0_4_;
  uStack_2464 = uStack_2524 ^ (uint)auVar55._0_4_;
  uStack_2460 = uStack_2520 ^ (uint)auVar55._0_4_;
  uStack_245c = uStack_251c ^ (uint)auVar55._0_4_;
  auVar6 = vmovshdup_avx(auVar49);
  local_2498 = auVar6._0_8_;
  uStack_2490 = local_2498;
  uStack_2488 = local_2498;
  uStack_2480 = local_2498;
  auVar6 = vmovshdup_avx(auVar55);
  uVar28 = auVar6._0_4_;
  uVar9 = auVar6._4_4_;
  local_24b8 = local_2538 ^ uVar28;
  uStack_24b4 = uStack_2534 ^ uVar9;
  uStack_24b0 = uStack_2530 ^ uVar28;
  uStack_24ac = uStack_252c ^ uVar9;
  uStack_24a8 = uStack_2528 ^ uVar28;
  uStack_24a4 = uStack_2524 ^ uVar9;
  uStack_24a0 = uStack_2520 ^ uVar28;
  uStack_249c = uStack_251c ^ uVar9;
  auVar6 = vshufps_avx(auVar49,auVar49,0xaa);
  local_24d8 = auVar6._0_8_;
  uStack_24d0 = local_24d8;
  uStack_24c8 = local_24d8;
  uStack_24c0 = local_24d8;
  auVar6 = vshufps_avx(auVar55,auVar55,0xaa);
  uVar28 = auVar6._0_4_;
  uVar9 = auVar6._4_4_;
  local_24f8 = local_2538 ^ uVar28;
  uStack_24f4 = uStack_2534 ^ uVar9;
  uStack_24f0 = uStack_2530 ^ uVar28;
  uStack_24ec = uStack_252c ^ uVar9;
  uStack_24e8 = uStack_2528 ^ uVar28;
  uStack_24e4 = uStack_2524 ^ uVar9;
  uStack_24e0 = uStack_2520 ^ uVar28;
  uStack_24dc = uStack_251c ^ uVar9;
  auVar75 = ZEXT1664(auVar44);
  uStack_2574 = local_2578;
  uStack_2570 = local_2578;
  uStack_256c = local_2578;
  uStack_2568 = local_2578;
  uStack_2564 = local_2578;
  uStack_2560 = local_2578;
  uStack_255c = local_2578;
  local_2518 = auVar59._0_4_;
  uStack_2514 = local_2518;
  uStack_2510 = local_2518;
  uStack_250c = local_2518;
  uStack_2508 = local_2518;
  uStack_2504 = local_2518;
  uStack_2500 = local_2518;
  uStack_24fc = local_2518;
  auVar6._4_4_ = uStack_25c4;
  auVar6._0_4_ = local_25c8;
  auVar6._8_4_ = uStack_25c0;
  auVar6._12_4_ = uStack_25bc;
  auVar6 = vblendvps_avx(auVar6,local_25a8,local_2678);
  auVar46 = ZEXT1664(auVar6);
  auVar64 = ZEXT1664(CONCAT412(fVar67,CONCAT48(fVar66,CONCAT44(fVar65,fVar62))));
LAB_0067814e:
  auVar43 = auVar46._0_16_;
  if (pSVar31 != stack) {
    pSVar40 = pSVar31 + -1;
    uVar29 = vmovmskps_avx(auVar61._0_16_);
    uVar30 = ~CONCAT44((int)((ulong)stack >> 0x20),uVar29) & pSVar31[-1].mask;
    if (uVar30 != 0) {
      sVar35 = (pSVar40->ptr).ptr;
      do {
        if ((sVar35 & 8) != 0) {
          if (uVar30 != 0) {
            uVar30 = (ulong)((uint)sVar35 & 0xf);
            local_25d8 = auVar61._0_16_;
            aVar45._0_8_ = auVar61._0_8_ ^ 0xffffffffffffffff;
            aVar45._8_4_ = auVar61._8_4_ ^ 0xffffffff;
            aVar45._12_4_ = auVar61._12_4_ ^ 0xffffffff;
            valid0.field_0 = aVar45;
            if (uVar30 == 8) goto LAB_0067842c;
            prim = (Primitive *)(sVar35 & 0xfffffffffffffff0);
            local_26d0 = 1;
            goto LAB_006783c3;
          }
          break;
        }
        auVar26._4_4_ = uStack_23b4;
        auVar26._0_4_ = local_23b8;
        auVar26._8_4_ = uStack_23b0;
        auVar26._12_4_ = uStack_23ac;
        auVar26._16_4_ = uStack_23a8;
        auVar26._20_4_ = uStack_23a4;
        auVar26._24_4_ = uStack_23a0;
        auVar26._28_4_ = uStack_239c;
        auVar27._4_4_ = fStack_2394;
        auVar27._0_4_ = local_2398;
        auVar27._8_4_ = fStack_2390;
        auVar27._12_4_ = fStack_238c;
        auVar27._16_4_ = fStack_2388;
        auVar27._20_4_ = fStack_2384;
        auVar27._24_4_ = fStack_2380;
        auVar27._28_4_ = fStack_237c;
        auVar43 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar35 + 0x40 + uVar38),auVar26,auVar27);
        auVar10._8_8_ = uStack_23d0;
        auVar10._0_8_ = local_23d8;
        auVar10._16_8_ = uStack_23c8;
        auVar10._24_8_ = uStack_23c0;
        auVar47 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar35 + 0x40 + uVar39),local_23f8,auVar10)
        ;
        auVar10 = vpmaxsd_avx2(ZEXT1632(auVar43),ZEXT1632(auVar47));
        auVar24._4_4_ = uStack_2434;
        auVar24._0_4_ = local_2438;
        auVar24._8_4_ = uStack_2430;
        auVar24._12_4_ = uStack_242c;
        auVar24._16_4_ = uStack_2428;
        auVar24._20_4_ = uStack_2424;
        auVar24._24_4_ = uStack_2420;
        auVar24._28_4_ = uStack_241c;
        auVar25._8_8_ = uStack_2410;
        auVar25._0_8_ = local_2418;
        auVar25._16_8_ = uStack_2408;
        auVar25._24_8_ = uStack_2400;
        auVar43 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar35 + 0x40 + uVar34),auVar24,auVar25);
        auVar11._4_4_ = uStack_2574;
        auVar11._0_4_ = local_2578;
        auVar11._8_4_ = uStack_2570;
        auVar11._12_4_ = uStack_256c;
        auVar11._16_4_ = uStack_2568;
        auVar11._20_4_ = uStack_2564;
        auVar11._24_4_ = uStack_2560;
        auVar11._28_4_ = uStack_255c;
        auVar11 = vpmaxsd_avx2(ZEXT1632(auVar43),auVar11);
        auVar10 = vpmaxsd_avx2(auVar10,auVar11);
        auVar22._4_4_ = uStack_2474;
        auVar22._0_4_ = local_2478;
        auVar22._8_4_ = uStack_2470;
        auVar22._12_4_ = uStack_246c;
        auVar22._16_4_ = uStack_2468;
        auVar22._20_4_ = uStack_2464;
        auVar22._24_4_ = uStack_2460;
        auVar22._28_4_ = uStack_245c;
        auVar23._4_4_ = fStack_2454;
        auVar23._0_4_ = local_2458;
        auVar23._8_4_ = fStack_2450;
        auVar23._12_4_ = fStack_244c;
        auVar23._16_4_ = fStack_2448;
        auVar23._20_4_ = fStack_2444;
        auVar23._24_4_ = fStack_2440;
        auVar23._28_4_ = fStack_243c;
        auVar43 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar35 + 0x40 + (uVar38 ^ 0x20)),auVar22,
                                  auVar23);
        auVar20._4_4_ = uStack_24b4;
        auVar20._0_4_ = local_24b8;
        auVar20._8_4_ = uStack_24b0;
        auVar20._12_4_ = uStack_24ac;
        auVar20._16_4_ = uStack_24a8;
        auVar20._20_4_ = uStack_24a4;
        auVar20._24_4_ = uStack_24a0;
        auVar20._28_4_ = uStack_249c;
        auVar21._8_8_ = uStack_2490;
        auVar21._0_8_ = local_2498;
        auVar21._16_8_ = uStack_2488;
        auVar21._24_8_ = uStack_2480;
        auVar47 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar35 + 0x40 + (uVar39 ^ 0x20)),auVar20,
                                  auVar21);
        auVar11 = vpminsd_avx2(ZEXT1632(auVar43),ZEXT1632(auVar47));
        auVar18._4_4_ = uStack_24f4;
        auVar18._0_4_ = local_24f8;
        auVar18._8_4_ = uStack_24f0;
        auVar18._12_4_ = uStack_24ec;
        auVar18._16_4_ = uStack_24e8;
        auVar18._20_4_ = uStack_24e4;
        auVar18._24_4_ = uStack_24e0;
        auVar18._28_4_ = uStack_24dc;
        auVar19._8_8_ = uStack_24d0;
        auVar19._0_8_ = local_24d8;
        auVar19._16_8_ = uStack_24c8;
        auVar19._24_8_ = uStack_24c0;
        auVar43 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar35 + 0x40 + (uVar34 ^ 0x20)),auVar18,
                                  auVar19);
        auVar12._4_4_ = uStack_2514;
        auVar12._0_4_ = local_2518;
        auVar12._8_4_ = uStack_2510;
        auVar12._12_4_ = uStack_250c;
        auVar12._16_4_ = uStack_2508;
        auVar12._20_4_ = uStack_2504;
        auVar12._24_4_ = uStack_2500;
        auVar12._28_4_ = uStack_24fc;
        auVar12 = vpminsd_avx2(ZEXT1632(auVar43),auVar12);
        auVar11 = vpminsd_avx2(auVar11,auVar12);
        auVar10 = vcmpps_avx(auVar10,auVar11,2);
        auVar46 = ZEXT3264(auVar10);
        uVar28 = vmovmskps_avx(auVar10);
        if (uVar28 == 0) {
          bVar42 = false;
        }
        else {
          uVar36 = (ulong)(uVar28 & 0xff);
          uVar30 = 0;
          sVar32 = 8;
          do {
            lVar13 = 0;
            for (uVar14 = uVar36; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
              lVar13 = lVar13 + 1;
            }
            uVar29 = *(undefined4 *)(sVar35 + 0x40 + lVar13 * 4);
            auVar44._4_4_ = uVar29;
            auVar44._0_4_ = uVar29;
            auVar44._8_4_ = uVar29;
            auVar44._12_4_ = uVar29;
            auVar49 = vfmadd213ps_fma(auVar44,auVar53,auVar64._0_16_);
            uVar29 = *(undefined4 *)(sVar35 + 0x80 + lVar13 * 4);
            auVar48._4_4_ = uVar29;
            auVar48._0_4_ = uVar29;
            auVar48._8_4_ = uVar29;
            auVar48._12_4_ = uVar29;
            auVar51 = vfmadd213ps_fma(auVar48,auVar4,auVar70._0_16_);
            uVar29 = *(undefined4 *)(sVar35 + 0xc0 + lVar13 * 4);
            auVar52._4_4_ = uVar29;
            auVar52._0_4_ = uVar29;
            auVar52._8_4_ = uVar29;
            auVar52._12_4_ = uVar29;
            auVar5._4_4_ = fStack_2554;
            auVar5._0_4_ = local_2558;
            auVar5._8_4_ = fStack_2550;
            auVar5._12_4_ = fStack_254c;
            auVar54 = vfmadd213ps_fma(auVar52,auVar3,auVar5);
            uVar29 = *(undefined4 *)(sVar35 + 0x60 + lVar13 * 4);
            auVar56._4_4_ = uVar29;
            auVar56._0_4_ = uVar29;
            auVar56._8_4_ = uVar29;
            auVar56._12_4_ = uVar29;
            auVar57 = vfmadd213ps_fma(auVar56,auVar53,auVar64._0_16_);
            uVar29 = *(undefined4 *)(sVar35 + 0xa0 + lVar13 * 4);
            auVar58._4_4_ = uVar29;
            auVar58._0_4_ = uVar29;
            auVar58._8_4_ = uVar29;
            auVar58._12_4_ = uVar29;
            auVar59 = vfmadd213ps_fma(auVar58,auVar4,auVar70._0_16_);
            uVar29 = *(undefined4 *)(sVar35 + 0xe0 + lVar13 * 4);
            auVar60._4_4_ = uVar29;
            auVar60._0_4_ = uVar29;
            auVar60._8_4_ = uVar29;
            auVar60._12_4_ = uVar29;
            auVar5 = vfmadd213ps_fma(auVar60,auVar3,auVar5);
            auVar43 = vpminsd_avx(auVar49,auVar57);
            auVar47 = vpminsd_avx(auVar51,auVar59);
            auVar43 = vpmaxsd_avx(auVar43,auVar47);
            auVar47 = vpminsd_avx(auVar54,auVar5);
            auVar47 = vpmaxsd_avx(auVar47,auVar6);
            auVar43 = vpmaxsd_avx(auVar43,auVar47);
            auVar47 = vpmaxsd_avx(auVar49,auVar57);
            auVar49 = vpmaxsd_avx(auVar51,auVar59);
            auVar49 = vpminsd_avx(auVar47,auVar49);
            auVar47 = vpmaxsd_avx(auVar54,auVar5);
            auVar47 = vpminsd_avx(auVar47,(undefined1  [16])bi_8.field_0);
            auVar47 = vpminsd_avx(auVar49,auVar47);
            auVar43 = vcmpps_avx(auVar43,auVar47,2);
            auVar46 = ZEXT1664(auVar43);
            uVar28 = vmovmskps_avx(auVar43);
            sVar33 = sVar32;
            if (uVar28 != 0) {
              sVar33 = *(size_t *)(sVar35 + lVar13 * 8);
              if (sVar32 != 8) {
                (pSVar40->ptr).ptr = sVar32;
                pSVar40->mask = uVar30;
                pSVar40 = pSVar40 + 1;
              }
              uVar30 = (ulong)(uVar28 & 0xff);
            }
            uVar36 = uVar36 - 1 & uVar36;
            sVar32 = sVar33;
          } while (uVar36 != 0);
          bVar42 = sVar33 != 8;
          sVar35 = sVar33;
        }
      } while (bVar42);
    }
    bVar41 = false;
    pSVar31 = pSVar40;
    goto LAB_006784bd;
  }
  goto LAB_006784ce;
  while( true ) {
    prim = prim + 1;
    bVar42 = uVar30 - 8 <= local_26d0;
    local_26d0 = local_26d0 + 1;
    if (bVar42) break;
LAB_006783c3:
    InstanceIntersectorK<4>::occluded
              ((InstanceIntersectorK<4> *)&local_2548,&valid0,&pre,ray,context,prim);
    aVar2.v = (__m128)vandnps_avx(local_2548.v,valid0.field_0);
    auVar43 = (undefined1  [16])valid0.field_0 & ~(undefined1  [16])local_2548;
    aVar45 = local_2548;
    valid0.field_0 = aVar2;
    if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar43 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar43 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar43[0xf])
    break;
  }
LAB_0067842c:
  auVar43 = vpcmpeqd_avx((undefined1  [16])aVar45,(undefined1  [16])aVar45);
  auVar47 = vpor_avx(local_25d8,auVar43 ^ (undefined1  [16])valid0.field_0);
  auVar61 = ZEXT1664(auVar47);
  auVar43 = vpandn_avx(auVar47,local_2678);
  auVar46 = ZEXT1664(auVar43);
  local_2678 = local_2678 & ~auVar47;
  bVar16 = (local_2678 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar17 = (local_2678 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar15 = (local_2678 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar42 = -1 < local_2678[0xf];
  bVar41 = ((bVar16 && bVar17) && bVar15) && bVar42;
  if (((!bVar16 || !bVar17) || !bVar15) || !bVar42) {
    auVar49._8_4_ = 0xff800000;
    auVar49._0_8_ = 0xff800000ff800000;
    auVar49._12_4_ = 0xff800000;
    bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                   vblendvps_avx((undefined1  [16])bi_8.field_0,auVar49,auVar47);
  }
  auVar75 = ZEXT1664(auVar50);
  auVar64 = ZEXT1664(CONCAT412(fVar67,CONCAT48(fVar66,CONCAT44(fVar65,fVar62))));
  auVar70 = ZEXT1664(CONCAT412(fVar73,CONCAT48(fVar72,CONCAT44(fVar71,fVar68))));
  pSVar31 = pSVar40;
  local_2678 = auVar43;
LAB_006784bd:
  auVar43 = auVar46._0_16_;
  if (bVar41) goto LAB_006784ce;
  goto LAB_0067814e;
LAB_006784ce:
  if (uVar37 == 0) {
    auVar6 = vpcmpeqd_avx(auVar43,auVar43);
    auVar6 = vpcmpeqd_avx(auVar6,(undefined1  [16])local_25e8);
    auVar6 = vpand_avx(auVar61._0_16_,auVar6);
    auVar50._8_4_ = 0xff800000;
    auVar50._0_8_ = 0xff800000ff800000;
    auVar50._12_4_ = 0xff800000;
    auVar6 = vmaskmovps_avx(auVar6,auVar50);
    *(undefined1 (*) [16])(ray + 0x80) = auVar6;
    return;
  }
  goto LAB_00677d5d;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occludedCoherent(vint<K>* __restrict__ valid_i,
                                                                                                      Accel::Intersectors* __restrict__ This,
                                                                                                      RayK<K>& __restrict__ ray,
                                                                                                      RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid,ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vbool<K> terminated = !valid;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar,  vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemMaskT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemMaskT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].mask = movemask(octant_valid);

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node of active rays have already been terminated */
          size_t m_active = (size_t)stackPtr->mask & (~(size_t)movemask(terminated));

          if (unlikely(m_active == 0)) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            m_active = 0;

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            //size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const NodeRef child = node->child(i);
                assert(child != BVH::emptyNode);
                BVHN<N>::prefetch(child);
                if (likely(cur != BVH::emptyNode)) {
                  //num_child_hits++;
                  stackPtr->ptr  = cur;
                  stackPtr->mask = m_active;
                  stackPtr++;
                }
                cur = child;
                m_active = movemask(lhit);
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
#if defined(__AVX__)
          STAT3(normal.trav_leaves, 1, popcnt(m_active), K);
#endif
          if (unlikely(!m_active)) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
          octant_valid &= !terminated;
          if (unlikely(none(octant_valid))) break;
          tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

          if (unlikely(lazy_node)) {
            stackPtr->ptr  = lazy_node;
            stackPtr->mask = movemask(octant_valid);
            stackPtr++;
          }
        }
      } while(valid_bits);

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }